

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O3

Am_Value_List __thiscall Am_Value_List::Recursive_Copy(Am_Value_List *this)

{
  uint *puVar1;
  Am_Value_List_Data *pAVar2;
  Am_Wrapper *pAVar3;
  Am_ID_Tag AVar4;
  Am_Value_List_Data *this_00;
  Am_List_Item *extraout_RDX;
  Am_List_Item *extraout_RDX_00;
  Am_List_Item *pAVar5;
  Am_List_Item *extraout_RDX_01;
  undefined8 *in_RSI;
  Am_List_Item *list_value;
  Am_Value_List AVar6;
  Am_Value v;
  Am_Value_List this_list;
  Am_Value_List local_50;
  Am_Value_List local_40;
  
  pAVar2 = (Am_Value_List_Data *)*in_RSI;
  if (pAVar2 == (Am_Value_List_Data *)0x0) {
    Am_Value_List(this,&Am_No_Value_List);
    pAVar5 = extraout_RDX_01;
  }
  else {
    this_00 = (Am_Value_List_Data *)operator_new(0x20);
    Am_Value_List_Data::Am_Value_List_Data(this_00,pAVar2);
    list_value = this_00->head;
    pAVar5 = extraout_RDX;
    if (list_value != (Am_List_Item *)0x0) {
      AVar4 = Am_Value_List_Data::id;
      do {
        if ((list_value->super_Am_Value).type == AVar4) {
          Am_Value_List(&local_40,&list_value->super_Am_Value);
          Recursive_Copy(&local_50);
          pAVar2 = (Am_Value_List_Data *)CONCAT62(local_50.data._2_6_,local_50.data._0_2_);
          local_40.item = local_50.item;
          if (pAVar2 != (Am_Value_List_Data *)0x0) {
            puVar1 = &(pAVar2->super_Am_Wrapper).refs;
            *puVar1 = *puVar1 + 1;
          }
          if (local_40.data != (Am_Value_List_Data *)0x0) {
            puVar1 = &((local_40.data)->super_Am_Wrapper).refs;
            *puVar1 = *puVar1 - 1;
            if (*puVar1 == 0) {
              pAVar3 = &(local_40.data)->super_Am_Wrapper;
              local_40.data = pAVar2;
              (*(pAVar3->super_Am_Registered_Type)._vptr_Am_Registered_Type[4])();
              pAVar2 = local_40.data;
            }
          }
          local_40.data = pAVar2;
          ~Am_Value_List(&local_50);
          local_50.data._0_2_ = 0;
          local_50.item = (Am_List_Item *)0x0;
          if (local_40.data != (Am_Value_List_Data *)0x0) {
            puVar1 = &((local_40.data)->super_Am_Wrapper).refs;
            *puVar1 = *puVar1 + 1;
          }
          Am_Value::operator=((Am_Value *)&local_50,&(local_40.data)->super_Am_Wrapper);
          Am_Value::operator=(&list_value->super_Am_Value,(Am_Value *)&local_50);
          Am_Value::~Am_Value((Am_Value *)&local_50);
          ~Am_Value_List(&local_40);
          pAVar5 = extraout_RDX_00;
          AVar4 = Am_Value_List_Data::id;
        }
        list_value = list_value->next;
      } while (list_value != (Am_List_Item *)0x0);
    }
    this->data = this_00;
  }
  AVar6.item = pAVar5;
  AVar6.data = (Am_Value_List_Data *)this;
  return AVar6;
}

Assistant:

Am_Value_List
Am_Value_List::Recursive_Copy()
{
  if (data) {
    Am_Value_List_Data *new_data = new Am_Value_List_Data(data);
    Am_List_Item *this_item = new_data->head;
    while (this_item) {
      if (this_item->type == Am_Value_List::Type_ID()) {
        Am_Value_List this_list = (*this_item);
        this_list = this_list.Recursive_Copy();
        Am_Value v;
        v = this_list;
        *this_item = v;
      }
      this_item = this_item->next;
    }
    return Am_Value_List(new_data);
  } else
    return Am_No_Value_List;
}